

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O0

void __thiscall re2::Regexp::Walker<re2::Regexp_*>::Walker(Walker<re2::Regexp_*> *this)

{
  stack<re2::WalkState<re2::Regexp*>,std::deque<re2::WalkState<re2::Regexp*>,std::allocator<re2::WalkState<re2::Regexp*>>>>
  *this_00;
  Walker<re2::Regexp_*> *this_local;
  
  this->_vptr_Walker = (_func_int **)&PTR__Walker_001a5dc8;
  this_00 = (stack<re2::WalkState<re2::Regexp*>,std::deque<re2::WalkState<re2::Regexp*>,std::allocator<re2::WalkState<re2::Regexp*>>>>
             *)operator_new(0x50);
  std::
  stack<re2::WalkState<re2::Regexp*>,std::deque<re2::WalkState<re2::Regexp*>,std::allocator<re2::WalkState<re2::Regexp*>>>>
  ::
  stack<std::deque<re2::WalkState<re2::Regexp*>,std::allocator<re2::WalkState<re2::Regexp*>>>,void>
            (this_00);
  this->stack_ = (stack<re2::WalkState<re2::Regexp_*>,_std::deque<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>_>
                  *)this_00;
  this->stopped_early_ = false;
  return;
}

Assistant:

Regexp::Walker<T>::Walker() {
  stack_ = new stack<WalkState<T> >;
  stopped_early_ = false;
}